

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::ImageSamplingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,ImageSamplingInstance *this)

{
  ostringstream *this_00;
  float fVar1;
  TestTexture *pTVar2;
  TestLog *pTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  deUint32 queueFamilyIndex;
  VkPhysicalDeviceProperties *pVVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  bool bVar11;
  ConstPixelBufferAccess *pCVar12;
  long lVar13;
  void *__buf;
  void *__buf_00;
  bool bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  Vec2 lodBounds;
  long local_590;
  string local_588;
  string local_568;
  VkImageSubresourceRange subresource;
  string local_528;
  string local_508;
  Vec4 lookupScale;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  LookupPrecision local_4b8;
  Vec4 lookupBias;
  ConstPixelBufferAccess coordAccess;
  undefined1 local_448 [12];
  HorizontalFill HStack_43c;
  undefined1 local_438 [16];
  _Alloc_hider local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [4];
  ios_base local_3d0 [64];
  PointState local_390;
  WindowRectangle local_38c;
  int local_37c [2];
  LineState local_374;
  bool local_370;
  undefined8 local_36c;
  LookupPrecision relaxedPrecision;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [6];
  ConstPixelBufferAccess resultAccess;
  TextureLevel errorMask;
  TextureFormat depthStencilFormat;
  TextureFormat colorFormat;
  CoordinateCaptureProgram coordCaptureProgram;
  Sampler sampler;
  Program rrProgram;
  ReferenceRenderer refRenderer;
  PixelBufferAccess errorAccess;
  
  pVVar10 = Context::getDeviceProperties((this->super_TestInstance).m_context);
  colorFormat.order = RGBA;
  colorFormat.type = FLOAT;
  depthStencilFormat.order = CHANNELORDER_LAST;
  depthStencilFormat.type = CHANNELTYPE_LAST;
  CoordinateCaptureProgram::CoordinateCaptureProgram(&coordCaptureProgram);
  rrProgram.vertexShader = &coordCaptureProgram.m_vertexShader.super_VertexShader;
  rrProgram.fragmentShader = &coordCaptureProgram.m_fragmentShader.super_FragmentShader;
  rrProgram.geometryShader = (GeometryShader *)0x0;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &colorFormat,&depthStencilFormat,&rrProgram);
  lookupScale.m_data[0] = 1.0;
  lookupScale.m_data[1] = 1.0;
  lookupScale.m_data[2] = 1.0;
  lookupScale.m_data[3] = 1.0;
  lookupBias.m_data[0] = 0.0;
  lookupBias.m_data[1] = 0.0;
  lookupBias.m_data[2] = 0.0;
  lookupBias.m_data[3] = 0.0;
  getLookupScaleBias(this->m_imageFormat,&lookupScale,&lookupBias);
  ReferenceRenderer::getViewportState(&refRenderer);
  local_448._0_4_ = R;
  local_448._4_4_ = SNORM_INT16;
  local_448._8_4_ = WINDING_CCW;
  HStack_43c = FILL_LEFT;
  local_438._0_4_ = FILL_BOTTOM;
  local_438._4_4_ = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)(local_438 + 8));
  local_390.pointSize = 1.0;
  local_38c.left = relaxedPrecision.coordBits.m_data[0];
  local_38c.bottom = relaxedPrecision.coordBits.m_data[1];
  local_38c.width = relaxedPrecision.coordBits.m_data[2];
  local_38c.height = relaxedPrecision.uvwBits.m_data[0];
  local_37c[0] = relaxedPrecision.uvwBits.m_data[1];
  local_37c[1] = relaxedPrecision.uvwBits.m_data[2];
  local_374.lineWidth = 1.0;
  local_370 = false;
  local_36c = 0xffffffff;
  local_438._4_4_ = VIEWPORTORIENTATION_LOWER_LEFT;
  ReferenceRenderer::draw
            (&refRenderer,(RenderState *)local_448,PRIMITIVETYPE_TRIANGLES,&this->m_vertices);
  ::vk::mapVkSampler(&sampler,&this->m_samplerParams);
  fVar16 = (this->m_samplerParams).mipLodBias + this->m_samplerLod;
  fVar1 = (this->m_samplerParams).minLod;
  fVar17 = (this->m_samplerParams).maxLod;
  if (fVar16 <= fVar17) {
    fVar17 = fVar16;
  }
  uVar15 = -(uint)(fVar16 < fVar1);
  fVar1 = (float)(uVar15 & (uint)fVar1 | ~uVar15 & (uint)fVar17);
  fVar17 = 1.0 / (float)~(-1 << ((byte)(pVVar10->limits).mipmapPrecisionBits & 0x1f));
  lodBounds.m_data[0] = fVar1 - fVar17;
  lodBounds.m_data[1] = fVar17 + fVar1;
  pTVar2 = (this->m_texture).
           super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
           .m_data.ptr;
  subresource.layerCount = (this->m_subresourceRange).layerCount;
  subresource.aspectMask = (this->m_subresourceRange).aspectMask;
  subresource.baseMipLevel = (this->m_subresourceRange).baseMipLevel;
  subresource.levelCount = (this->m_subresourceRange).levelCount;
  subresource.baseArrayLayer = (this->m_subresourceRange).baseArrayLayer;
  if ((this->m_subresourceRange).levelCount == 0xffffffff) {
    iVar9 = (*pTVar2->_vptr_TestTexture[2])(pTVar2);
    subresource.levelCount = iVar9 - (this->m_subresourceRange).baseMipLevel;
  }
  if ((this->m_subresourceRange).layerCount == 0xffffffff) {
    iVar9 = (*pTVar2->_vptr_TestTexture[4])(pTVar2);
    subresource.layerCount = iVar9 - (this->m_subresourceRange).baseArrayLayer;
  }
  ReferenceRenderer::getAccess((PixelBufferAccess *)local_448,&refRenderer);
  coordAccess.m_size.m_data[1] = HStack_43c;
  coordAccess.m_size.m_data[0] = local_448._8_4_;
  coordAccess.m_format.order = local_448._0_4_;
  coordAccess.m_format.type = local_448._4_4_;
  coordAccess.m_size.m_data[2] = local_438._0_4_;
  coordAccess.m_pitch.m_data[1] = local_438._8_4_;
  coordAccess.m_pitch.m_data[0] = local_438._4_4_;
  coordAccess.m_pitch.m_data[2] = local_438._12_4_;
  coordAccess.m_data = local_428._M_p;
  local_448._0_4_ = RGBA;
  local_448._4_4_ = UNORM_INT8;
  tcu::TextureLevel::TextureLevel
            (&errorMask,(TextureFormat *)local_448,(this->m_renderSize).m_data[0],
             (this->m_renderSize).m_data[1],1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&errorAccess.super_ConstPixelBufferAccess,&errorMask);
  iVar9 = (*((this->m_texture).
             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             .m_data.ptr)->_vptr_TestTexture[0xe])();
  bVar14 = true;
  if (*(int *)(CONCAT44(extraout_var,iVar9) + 4) == 0) {
    if ((this->m_samplerParams).minFilter == VK_FILTER_LINEAR) {
      bVar14 = false;
    }
    else {
      bVar14 = (this->m_samplerParams).magFilter != VK_FILTER_LINEAR;
    }
  }
  local_4b8.colorThreshold.m_data = (float  [4])ZEXT816(0);
  local_4b8.coordBits.m_data[0] = 0x11;
  local_4b8.coordBits.m_data[1] = 0x11;
  local_4b8.coordBits.m_data[2] = 0x11;
  local_4b8.uvwBits.m_data[0] = 5;
  local_4b8.uvwBits.m_data[1] = 5;
  local_4b8.uvwBits.m_data[2] = 5;
  local_4b8.colorMask.m_data[0] = true;
  local_4b8.colorMask.m_data[1] = true;
  local_4b8.colorMask.m_data[2] = true;
  local_4b8.colorMask.m_data[3] = true;
  resultAccess.m_format.order = RGBA;
  resultAccess.m_format.type = UNORM_SHORT_565;
  resultAccess.m_size.m_data[0] = 8;
  resultAccess.m_size.m_data[1] = 8;
  tcu::computeFixedPointThreshold((tcu *)&relaxedPrecision,(IVec4 *)&resultAccess);
  local_448._0_4_ = 0x3f800000;
  local_448._4_4_ = 0x3f800000;
  local_448._8_4_ = 0x3f800000;
  HStack_43c = lookupScale.m_data[0];
  local_438._0_4_ = lookupScale.m_data[1];
  local_438._4_4_ = lookupScale.m_data[2];
  local_438._8_4_ = lookupScale.m_data[3];
  auVar5._8_4_ = relaxedPrecision.coordBits.m_data[2];
  auVar5._12_4_ = relaxedPrecision.uvwBits.m_data[0];
  auVar5._0_4_ = relaxedPrecision.coordBits.m_data[0];
  auVar5._4_4_ = relaxedPrecision.coordBits.m_data[1];
  auVar4._4_4_ = *(undefined4 *)(local_448 + (ulong)(this->m_componentMapping).g * 4);
  auVar4._0_4_ = *(undefined4 *)(local_448 + (ulong)(this->m_componentMapping).r * 4);
  auVar4._8_4_ = *(undefined4 *)(local_448 + (ulong)(this->m_componentMapping).b * 4);
  auVar4._12_4_ = *(undefined4 *)(local_448 + (ulong)(this->m_componentMapping).a * 4);
  local_4b8.colorThreshold.m_data = (float  [4])divps(auVar5,auVar4);
  iVar9 = (*((this->m_texture).
             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             .m_data.ptr)->_vptr_TestTexture[0xe])();
  bVar7 = tcu::isSRGB(*(TextureFormat *)CONCAT44(extraout_var_00,iVar9));
  if (bVar7) {
    local_4b8.colorThreshold.m_data[1] = local_4b8.colorThreshold.m_data[1] + 0.015686275;
    local_4b8.colorThreshold.m_data[0] = local_4b8.colorThreshold.m_data[0] + 0.015686275;
    local_4b8.colorThreshold.m_data[2] = local_4b8.colorThreshold.m_data[2] + 0.015686275;
    local_4b8.colorThreshold.m_data[3] = local_4b8.colorThreshold.m_data[3] + 0.015686275;
  }
  if (this->m_imageCount < 1) {
    tcu::TextureLevel::~TextureLevel(&errorMask);
LAB_0050b8d8:
    local_448._0_8_ = local_438;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,"Result image matches reference","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_448._0_8_,
               (undefined1 *)(CONCAT44(HStack_43c,local_448._8_4_) + local_448._0_8_));
    if ((undefined1 *)local_448._0_8_ == local_438) goto LAB_0050b946;
  }
  else {
    bVar7 = true;
    local_590 = 0;
    lVar13 = 0;
    bVar11 = false;
    do {
      vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
      device = Context::getDevice((this->super_TestInstance).m_context);
      queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
      queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context)
      ;
      allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
      readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                          local_448,vk,device,queue,queueFamilyIndex,allocator,
                          (VkImage)**(deUint64 **)
                                     ((long)&((this->m_colorImages).
                                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                     local_590),this->m_colorFormat,&this->m_renderSize);
      result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr
           = (TextureLevel *)local_448._0_8_;
      local_448._0_4_ = R;
      local_448._4_4_ = SNORM_INT8;
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
                ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_448)
      ;
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)local_448,
                 result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                 m_data.ptr);
      resultAccess.m_format.order = local_448._0_4_;
      resultAccess.m_format.type = local_448._4_4_;
      resultAccess.m_size.m_data[2] = local_438._0_4_;
      resultAccess.m_size.m_data[1] = HStack_43c;
      resultAccess.m_size.m_data[0] = local_448._8_4_;
      resultAccess.m_pitch.m_data[2] = local_438._12_4_;
      resultAccess.m_pitch.m_data[1] = local_438._8_4_;
      resultAccess.m_pitch.m_data[0] = local_438._4_4_;
      resultAccess.m_data = local_428._M_p;
      pCVar12 = &resultAccess;
      bVar8 = pipeline::anon_unknown_0::validateResultImage
                        ((this->m_texture).
                         super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                         .m_data.ptr,this->m_imageViewType,&subresource,&sampler,
                         &this->m_componentMapping,&coordAccess,&lodBounds,&local_4b8,&lookupScale,
                         &lookupBias,pCVar12,
                         (PixelBufferAccess *)&errorAccess.super_ConstPixelBufferAccess);
      this_00 = (ostringstream *)(local_448 + 8);
      if (!bVar8 && !bVar14) {
        relaxedPrecision.coordBits.m_data[0] = 0x16;
        relaxedPrecision.coordBits.m_data[1] = 0x16;
        relaxedPrecision.coordBits.m_data[2] = 0x16;
        relaxedPrecision.uvwBits.m_data[0] = 0x10;
        relaxedPrecision.uvwBits.m_data[1] = 0x10;
        relaxedPrecision.uvwBits.m_data[2] = 0x10;
        relaxedPrecision.colorMask.m_data[0] = true;
        relaxedPrecision.colorMask.m_data[1] = true;
        relaxedPrecision.colorMask.m_data[2] = true;
        relaxedPrecision.colorMask.m_data[3] = true;
        relaxedPrecision.colorThreshold.m_data[0] = 0.015686275;
        relaxedPrecision.colorThreshold.m_data[1] = 0.015686275;
        relaxedPrecision.colorThreshold.m_data[2] = 0.015686275;
        relaxedPrecision.colorThreshold.m_data[3] = 0.015686275;
        local_448._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
                   ,0x53);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_3d0);
        bVar8 = pipeline::anon_unknown_0::validateResultImage
                          ((this->m_texture).
                           super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                           .m_data.ptr,this->m_imageViewType,&subresource,&sampler,
                           &this->m_componentMapping,&coordAccess,&lodBounds,&relaxedPrecision,
                           &lookupScale,&lookupBias,pCVar12,
                           (PixelBufferAccess *)&errorAccess.super_ConstPixelBufferAccess);
        bVar11 = true;
      }
      bVar6 = 1;
      if (bVar8 == false) {
        pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Result","");
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"Result Image","");
        tcu::LogImage::LogImage
                  ((LogImage *)local_448,&local_568,&local_508,pCVar12,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar9 = (int)pTVar3;
        tcu::LogImage::write((LogImage *)local_448,iVar9,__buf,(size_t)pCVar12);
        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"ErrorMask","");
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"Error Mask","");
        pCVar12 = &errorAccess.super_ConstPixelBufferAccess;
        tcu::LogImage::LogImage
                  ((LogImage *)&relaxedPrecision,&local_588,&local_528,
                   &errorAccess.super_ConstPixelBufferAccess,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&relaxedPrecision,iVar9,__buf_00,(size_t)pCVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)relaxedPrecision.colorThreshold.m_data._8_8_ != local_298) {
          operator_delete((void *)relaxedPrecision.colorThreshold.m_data._8_8_,
                          local_298[0]._M_allocated_capacity + 1);
        }
        if ((int *)relaxedPrecision.coordBits.m_data._0_8_ != relaxedPrecision.uvwBits.m_data + 1) {
          operator_delete((void *)relaxedPrecision.coordBits.m_data._0_8_,
                          relaxedPrecision.uvwBits.m_data._4_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_p != local_418) {
          operator_delete(local_428._M_p,local_418[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_448._0_8_ != local_438) {
          operator_delete((void *)local_448._0_8_,CONCAT44(local_438._4_4_,local_438._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        bVar6 = 0;
      }
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
                (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                );
      bVar7 = (bool)(bVar7 & bVar6);
      lVar13 = lVar13 + 1;
      local_590 = local_590 + 0x10;
    } while (lVar13 < this->m_imageCount);
    tcu::TextureLevel::~TextureLevel(&errorMask);
    if (bVar7) {
      if (!bVar11) goto LAB_0050b8d8;
      local_448._0_8_ = local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Inaccurate filtering results","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_448._0_8_,
                 (undefined1 *)(CONCAT44(HStack_43c,local_448._8_4_) + local_448._0_8_));
    }
    else {
      local_448._0_8_ = local_438;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Image mismatch","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_448._0_8_,
                 (undefined1 *)(CONCAT44(HStack_43c,local_448._8_4_) + local_448._0_8_));
    }
    if ((undefined1 *)local_448._0_8_ == local_438) goto LAB_0050b946;
  }
  operator_delete((void *)local_448._0_8_,CONCAT44(local_438._4_4_,local_438._0_4_) + 1);
LAB_0050b946:
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  coordCaptureProgram.super_Program._vptr_Program =
       (_func_int **)&PTR__CoordinateCaptureProgram_00d2a0c8;
  rr::FragmentShader::~FragmentShader(&coordCaptureProgram.m_fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&coordCaptureProgram.m_vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSamplingInstance::verifyImage (void)
{
	const VkPhysicalDeviceLimits&		limits					= m_context.getDeviceProperties().limits;
	// \note Color buffer is used to capture coordinates - not sampled texture values
	const tcu::TextureFormat			colorFormat				(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
	const tcu::TextureFormat			depthStencilFormat;		// Undefined depth/stencil format.
	const CoordinateCaptureProgram		coordCaptureProgram;
	const rr::Program					rrProgram				= coordCaptureProgram.getReferenceProgram();
	ReferenceRenderer					refRenderer				(m_renderSize.x(), m_renderSize.y(), 1, colorFormat, depthStencilFormat, &rrProgram);

	bool								compareOkAll			= true;
	bool								anyWarnings				= false;

	tcu::Vec4							lookupScale				(1.0f);
	tcu::Vec4							lookupBias				(0.0f);

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	// Render out coordinates
	{
		const rr::RenderState renderState(refRenderer.getViewportState());
		refRenderer.draw(renderState, rr::PRIMITIVETYPE_TRIANGLES, m_vertices);
	}

	// Verify results
	{
		const tcu::Sampler					sampler			= mapVkSampler(m_samplerParams);
		const float							referenceLod	= de::clamp(m_samplerParams.mipLodBias + m_samplerLod, m_samplerParams.minLod, m_samplerParams.maxLod);
		const float							lodError		= 1.0f / static_cast<float>((1u << limits.mipmapPrecisionBits) - 1u);
		const tcu::Vec2						lodBounds		(referenceLod - lodError, referenceLod + lodError);
		const vk::VkImageSubresourceRange	subresource		= resolveSubresourceRange(*m_texture, m_subresourceRange);

		const tcu::ConstPixelBufferAccess	coordAccess		= refRenderer.getAccess();
		tcu::TextureLevel					errorMask		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), (int)m_renderSize.x(), (int)m_renderSize.y());
		const tcu::PixelBufferAccess		errorAccess		= errorMask.getAccess();

		const bool							allowSnorm8Bug	= m_texture->getTextureFormat().type == tcu::TextureFormat::SNORM_INT8 &&
															  (m_samplerParams.minFilter == VK_FILTER_LINEAR || m_samplerParams.magFilter == VK_FILTER_LINEAR);

		tcu::LookupPrecision				lookupPrecision;

		// Set precision requirements - very low for these tests as
		// the point of the test is not to validate accuracy.
		lookupPrecision.coordBits		= tcu::IVec3(17, 17, 17);
		lookupPrecision.uvwBits			= tcu::IVec3(5, 5, 5);
		lookupPrecision.colorMask		= tcu::BVec4(true);
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(tcu::IVec4(8, 8, 8, 8)) / swizzleScaleBias(lookupScale, m_componentMapping);

		if (tcu::isSRGB(m_texture->getTextureFormat()))
			lookupPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

		for (int imgNdx = 0; imgNdx < m_imageCount; ++imgNdx)
		{
			// Read back result image
			UniquePtr<tcu::TextureLevel>		result			(readColorAttachment(m_context.getDeviceInterface(),
																					 m_context.getDevice(),
																					 m_context.getUniversalQueue(),
																					 m_context.getUniversalQueueFamilyIndex(),
																					 m_context.getDefaultAllocator(),
																					 **m_colorImages[imgNdx],
																					 m_colorFormat,
																					 m_renderSize));
			const tcu::ConstPixelBufferAccess	resultAccess	= result->getAccess();
			bool								compareOk		= validateResultImage(*m_texture,
																					  m_imageViewType,
																					  subresource,
																					  sampler,
																					  m_componentMapping,
																					  coordAccess,
																					  lodBounds,
																					  lookupPrecision,
																					  lookupScale,
																					  lookupBias,
																					  resultAccess,
																					  errorAccess);

			if (!compareOk && allowSnorm8Bug)
			{
				// HW waiver (VK-GL-CTS issue: 229)
				//
				// Due to an error in bit replication of the fixed point SNORM values, linear filtered
				// negative SNORM values will differ slightly from ideal precision in the last bit, moving
				// the values towards 0.
				//
				// This occurs on all members of the PowerVR Rogue family of GPUs
				tcu::LookupPrecision	relaxedPrecision;

				relaxedPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
					<< tcu::TestLog::EndMessage;
				anyWarnings = true;

				compareOk = validateResultImage(*m_texture,
												m_imageViewType,
												subresource,
												sampler,
												m_componentMapping,
												coordAccess,
												lodBounds,
												relaxedPrecision,
												lookupScale,
												lookupBias,
												resultAccess,
												errorAccess);
			}

			if (!compareOk)
				m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Result", "Result Image", resultAccess)
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorAccess);

			compareOkAll = compareOkAll && compareOk;
		}
	}

	if (compareOkAll)
	{
		if (anyWarnings)
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Inaccurate filtering results");
		else
			return tcu::TestStatus::pass("Result image matches reference");
	}
	else
		return tcu::TestStatus::fail("Image mismatch");
}